

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O0

int Sfm_NodeResubSolve(Sfm_Ntk_t *p,int iNode,int f,int fRemoveOnly)

{
  Vec_Wrd_t *p_00;
  Vec_Int_t *pVVar1;
  Sfm_Ntk_t *pSVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  abctime aVar11;
  abctime aVar12;
  int local_fc;
  abctime clk;
  word uMask;
  word uSign;
  word uTruth;
  int iFaninSkip;
  int iFaninRem;
  int iVar;
  int iFanin;
  int i;
  int fVeryVerbose;
  int fSkipUpdate;
  int fRemoveOnly_local;
  int f_local;
  int iNode_local;
  Sfm_Ntk_t *p_local;
  
  i = 0;
  iFanin = 0;
  iFaninSkip = -1;
  uTruth._4_4_ = -1;
  uTruth._0_4_ = -1;
  fVeryVerbose = fRemoveOnly;
  fSkipUpdate = f;
  fRemoveOnly_local = iNode;
  _f_local = p;
  iVar3 = Sfm_ObjIsNode(p,iNode);
  iVar10 = fSkipUpdate;
  if (iVar3 == 0) {
    __assert_fail("Sfm_ObjIsNode(p, iNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmCore.c"
                  ,0x75,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
  }
  if ((fSkipUpdate < 0) ||
     (iVar4 = Sfm_ObjFaninNum(_f_local,fRemoveOnly_local), iVar3 = fRemoveOnly_local,
     iVar4 <= iVar10)) {
    __assert_fail("f >= 0 && f < Sfm_ObjFaninNum(p, iNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmCore.c"
                  ,0x76,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
  }
  _f_local->nTryRemoves = _f_local->nTryRemoves + 1;
  if (_f_local->pPars->fVeryVerbose != 0) {
    uVar5 = Sfm_ObjLevel(_f_local,fRemoveOnly_local);
    uVar6 = Vec_IntSize(_f_local->vNodes);
    uVar7 = Vec_IntSize(_f_local->vDivs);
    iVar4 = Sfm_ObjFanin(_f_local,fRemoveOnly_local,fSkipUpdate);
    iVar10 = fSkipUpdate;
    iVar8 = Sfm_ObjFaninNum(_f_local,fRemoveOnly_local);
    pSVar2 = _f_local;
    iVar9 = Sfm_ObjFanin(_f_local,fRemoveOnly_local,fSkipUpdate);
    iVar9 = Sfm_ObjMffcSize(pSVar2,iVar9);
    printf("%5d : Lev =%3d. Leaf =%3d.  Node =%3d.  Div=%3d.  Fanin =%4d (%d/%d). MFFC = %d\n",
           (ulong)(uint)iVar3,(ulong)uVar5,0,(ulong)uVar6,(ulong)uVar7,iVar4,iVar10,iVar8,iVar9);
  }
  _f_local->nCexes = 0;
  p_00 = _f_local->vDivCexes;
  iVar10 = Vec_IntSize(_f_local->vDivs);
  Vec_WrdFill(p_00,iVar10,0);
  Vec_IntClear(_f_local->vDivIds);
  for (iVar = 0; iVar10 = iVar, iVar3 = Sfm_ObjFaninNum(_f_local,fRemoveOnly_local), iVar10 < iVar3;
      iVar = iVar + 1) {
    iFaninRem = Sfm_ObjFanin(_f_local,fRemoveOnly_local,iVar);
    iVar10 = iFaninRem;
    if (iVar != fSkipUpdate) {
      pVVar1 = _f_local->vDivIds;
      iVar10 = Sfm_ObjSatVar(_f_local,iFaninRem);
      Vec_IntPush(pVVar1,iVar10);
      iVar10 = uTruth._4_4_;
    }
    uTruth._4_4_ = iVar10;
  }
  if (uTruth._4_4_ == -1) {
    __assert_fail("iFaninRem != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmCore.c"
                  ,0x87,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
  }
  iVar10 = Sfm_ObjIsFixed(_f_local,uTruth._4_4_);
  if ((iVar10 != 0) && (iVar10 = Sfm_ObjFaninNum(_f_local,uTruth._4_4_), iVar10 == 1)) {
    uTruth._0_4_ = Sfm_ObjFanin(_f_local,uTruth._4_4_,0);
  }
  aVar11 = Abc_Clock();
  uSign = Sfm_ComputeInterpolant(_f_local);
  aVar12 = Abc_Clock();
  _f_local->timeSat = (aVar12 - aVar11) + _f_local->timeSat;
  if (uSign == 0x1234567812345678) {
    _f_local->nTimeOuts = _f_local->nTimeOuts + 1;
    p_local._4_4_ = 0;
  }
  else if (uSign == 0x8765432187654321) {
    if (((fVeryVerbose == 0) && (_f_local->pPars->fRrOnly == 0)) &&
       (iVar10 = Vec_IntSize(_f_local->vDivs), iVar10 != 0)) {
      _f_local->nTryResubs = _f_local->nTryResubs + 1;
      if (iFanin != 0) {
        for (iVar = 0; iVar < 9; iVar = iVar + 1) {
          printf(" ");
        }
        for (iVar = 0; iVar10 = iVar, iVar3 = Vec_IntSize(_f_local->vDivs), iVar10 < iVar3;
            iVar = iVar + 1) {
          printf("%d",(long)iVar % 10 & 0xffffffff);
        }
        printf("\n");
      }
      while( true ) {
        if (iFanin != 0) {
          printf("%3d: %3d ",(ulong)(uint)_f_local->nCexes,(ulong)(uint)iFaninSkip);
          for (iVar = 0; iVar10 = iVar, iVar3 = Vec_WrdSize(_f_local->vDivCexes), iVar10 < iVar3;
              iVar = iVar + 1) {
            uMask = Vec_WrdEntry(_f_local->vDivCexes,iVar);
            uVar5 = Abc_InfoHasBit((uint *)&uMask,_f_local->nCexes + -1);
            printf("%d",(ulong)uVar5);
          }
          printf("\n");
        }
        iVar10 = _f_local->nCexes;
        iFaninSkip = 0;
        while ((iVar3 = iFaninSkip, iVar4 = Vec_WrdSize(_f_local->vDivCexes), iVar3 < iVar4 &&
               ((uMask = Vec_WrdEntry(_f_local->vDivCexes,iFaninSkip),
                uMask != 0xffffffffffffffffU >> (0x40U - (char)iVar10 & 0x3f) ||
                (iVar3 = Vec_IntEntry(_f_local->vDivs,iFaninSkip), iVar3 == (int)uTruth))))) {
          iFaninSkip = iFaninSkip + 1;
        }
        iVar10 = iFaninSkip;
        iVar3 = Vec_IntSize(_f_local->vDivs);
        if (iVar10 == iVar3) {
          return 0;
        }
        iVar10 = Vec_IntEntry(_f_local->vDivs,iFaninSkip);
        pSVar2 = _f_local;
        if (iVar10 == (int)uTruth) {
          __assert_fail("Vec_IntEntry(p->vDivs, iVar) != iFaninSkip",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmCore.c"
                        ,0xb2,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
        }
        pVVar1 = _f_local->vDivIds;
        iVar10 = Vec_IntEntry(_f_local->vDivs,iFaninSkip);
        iVar10 = Sfm_ObjSatVar(pSVar2,iVar10);
        Vec_IntPush(pVVar1,iVar10);
        aVar11 = Abc_Clock();
        uSign = Sfm_ComputeInterpolant(_f_local);
        aVar12 = Abc_Clock();
        _f_local->timeSat = (aVar12 - aVar11) + _f_local->timeSat;
        if (uSign == 0x1234567812345678) {
          _f_local->nTimeOuts = _f_local->nTimeOuts + 1;
          return 0;
        }
        if (uSign != 0x8765432187654321) goto LAB_006564f6;
        if (_f_local->nCexes == 0x40) break;
        Vec_IntPop(_f_local->vDivIds);
      }
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
LAB_006564f6:
    iVar3 = fRemoveOnly_local;
    iVar10 = fSkipUpdate;
    if (_f_local->pPars->fVeryVerbose != 0) {
      if (iFaninSkip == -1) {
        uVar5 = Sfm_ObjFanin(_f_local,fRemoveOnly_local,fSkipUpdate);
        printf("Node %d: Fanin %d (%d) can be removed.  ",(ulong)(uint)iVar3,(ulong)(uint)iVar10,
               (ulong)uVar5);
      }
      else {
        uVar5 = Sfm_ObjFanin(_f_local,fRemoveOnly_local,fSkipUpdate);
        iVar4 = iFaninSkip;
        uVar6 = Vec_IntEntry(_f_local->vDivs,iFaninSkip);
        printf("Node %d: Fanin %d (%d) can be replaced by divisor %d (%d).   ",(ulong)(uint)iVar3,
               (ulong)(uint)iVar10,(ulong)uVar5,(ulong)(uint)iVar4,(ulong)uVar6);
      }
      iVar10 = Vec_IntSize(_f_local->vDivIds);
      Kit_DsdPrintFromTruth((uint *)&uSign,iVar10);
      printf("\n");
    }
    pSVar2 = _f_local;
    iVar3 = fRemoveOnly_local;
    iVar10 = fSkipUpdate;
    if (iFaninSkip == -1) {
      _f_local->nRemoves = _f_local->nRemoves + 1;
    }
    else {
      _f_local->nResubs = _f_local->nResubs + 1;
    }
    if (i == 0) {
      if (iFaninSkip == -1) {
        local_fc = iFaninSkip;
      }
      else {
        local_fc = Vec_IntEntry(_f_local->vDivs,iFaninSkip);
      }
      Sfm_NtkUpdate(pSVar2,iVar3,iVar10,local_fc,uSign);
      p_local._4_4_ = 1;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Sfm_NodeResubSolve( Sfm_Ntk_t * p, int iNode, int f, int fRemoveOnly )
{
    int fSkipUpdate  = 0;
    int fVeryVerbose = 0;//p->pPars->fVeryVerbose && Vec_IntSize(p->vDivs) < 200;// || pNode->Id == 556;
    int i, iFanin, iVar = -1;
    int iFaninRem = -1, iFaninSkip = -1;
    word uTruth, uSign, uMask;
    abctime clk;
    assert( Sfm_ObjIsNode(p, iNode) );
    assert( f >= 0 && f < Sfm_ObjFaninNum(p, iNode) );
    p->nTryRemoves++;
    // report init stats
    if ( p->pPars->fVeryVerbose )
        printf( "%5d : Lev =%3d. Leaf =%3d.  Node =%3d.  Div=%3d.  Fanin =%4d (%d/%d). MFFC = %d\n", 
            iNode, Sfm_ObjLevel(p, iNode), 0, Vec_IntSize(p->vNodes), Vec_IntSize(p->vDivs), 
            Sfm_ObjFanin(p, iNode, f), f, Sfm_ObjFaninNum(p, iNode), Sfm_ObjMffcSize(p, Sfm_ObjFanin(p, iNode, f)) );
    // clean simulation info
    p->nCexes = 0;
    Vec_WrdFill( p->vDivCexes, Vec_IntSize(p->vDivs), 0 );
    // try removing the critical fanin
    Vec_IntClear( p->vDivIds );
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
        if ( i != f )
            Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, iFanin) );
        else
            iFaninRem = iFanin;
    assert( iFaninRem != -1 );
    // find fanin to skip 
    if ( Sfm_ObjIsFixed(p, iFaninRem) && Sfm_ObjFaninNum(p, iFaninRem) == 1 )
        iFaninSkip = Sfm_ObjFanin(p, iFaninRem, 0);
clk = Abc_Clock();
    uTruth = Sfm_ComputeInterpolant( p );
p->timeSat += Abc_Clock() - clk;
    // analyze outcomes
    if ( uTruth == SFM_SAT_UNDEC )
    {
        p->nTimeOuts++;
        return 0;
    }
    if ( uTruth != SFM_SAT_SAT )
        goto finish;
    if ( fRemoveOnly || p->pPars->fRrOnly || Vec_IntSize(p->vDivs) == 0 )
        return 0;

    p->nTryResubs++;
    if ( fVeryVerbose )
    {
        for ( i = 0; i < 9; i++ )
            printf( " " );
        for ( i = 0; i < Vec_IntSize(p->vDivs); i++ )
            printf( "%d", i % 10 );
        printf( "\n" );
    }
    while ( 1 ) 
    {
        if ( fVeryVerbose )
        {
            printf( "%3d: %3d ", p->nCexes, iVar );
            Vec_WrdForEachEntry( p->vDivCexes, uSign, i )
                printf( "%d", Abc_InfoHasBit((unsigned *)&uSign, p->nCexes-1) );
            printf( "\n" );
        }
        // find the next divisor to try
        uMask = (~(word)0) >> (64 - p->nCexes);
        Vec_WrdForEachEntry( p->vDivCexes, uSign, iVar )
            if ( uSign == uMask && Vec_IntEntry(p->vDivs, iVar) != iFaninSkip )
                break;
        if ( iVar == Vec_IntSize(p->vDivs) )
            return 0;
        assert( Vec_IntEntry(p->vDivs, iVar) != iFaninSkip );
        // try replacing the critical fanin
        Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, Vec_IntEntry(p->vDivs, iVar)) );
clk = Abc_Clock();
        uTruth = Sfm_ComputeInterpolant( p );
p->timeSat += Abc_Clock() - clk;
        // analyze outcomes
        if ( uTruth == SFM_SAT_UNDEC )
        {
            p->nTimeOuts++;
            return 0;
        }
        if ( uTruth != SFM_SAT_SAT )
            goto finish;
        if ( p->nCexes == 64 )
            return 0;
        // remove the last variable
        Vec_IntPop( p->vDivIds );
    }
finish:
    if ( p->pPars->fVeryVerbose )
    {
        if ( iVar == -1 )
            printf( "Node %d: Fanin %d (%d) can be removed.  ", iNode, f, Sfm_ObjFanin(p, iNode, f) );
        else
            printf( "Node %d: Fanin %d (%d) can be replaced by divisor %d (%d).   ", 
            iNode, f, Sfm_ObjFanin(p, iNode, f), iVar, Vec_IntEntry(p->vDivs, iVar) );
        Kit_DsdPrintFromTruth( (unsigned *)&uTruth, Vec_IntSize(p->vDivIds) ); printf( "\n" );
    }
    if ( iVar == -1 )
        p->nRemoves++;
    else
        p->nResubs++;
    if ( fSkipUpdate )
        return 0;
    // update the network
    Sfm_NtkUpdate( p, iNode, f, (iVar == -1 ? iVar : Vec_IntEntry(p->vDivs, iVar)), uTruth );
    return 1;
 }